

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O2

void __thiscall
write_point_ini::operator()(write_point_ini *this,way_point_le *point,xr_ini_writer *w,uint32_t id)

{
  int iVar1;
  undefined4 in_register_0000000c;
  size_t sVar2;
  void *__buf;
  char buffer [128];
  string asStack_c8 [32];
  char local_a8 [136];
  
  sVar2 = CONCAT44(in_register_0000000c,id);
  iVar1 = snprintf(local_a8,0x80,"wp_%d_flags");
  if (0 < iVar1) {
    xray_re::xr_ini_writer::write
              (w,(int)local_a8,(void *)(ulong)(point->super_way_point).flags,sVar2);
  }
  iVar1 = snprintf(local_a8,0x80,"wp_%d_name");
  if (0 < iVar1) {
    std::__cxx11::string::string(asStack_c8,(string *)point);
    xray_re::xr_ini_writer::write(w,(int)local_a8,asStack_c8,0);
    std::__cxx11::string::~string(asStack_c8);
  }
  sVar2 = (size_t)id;
  iVar1 = snprintf(local_a8,0x80,"wp_%d_pos");
  if (0 < iVar1) {
    xray_re::xr_ini_writer::write(w,(int)local_a8,__buf,sVar2);
  }
  iVar1 = snprintf(local_a8,0x80,"wp_%d_selected");
  if (0 < iVar1) {
    xray_re::xr_ini_writer::write(w,(int)local_a8,"off",0);
  }
  return;
}

Assistant:

void operator()(const way_point_le& point, xr_ini_writer* w, uint32_t id) const {
	char buffer[128];
	char* buf = &buffer[0];
	int n = xr_snprintf(buf, sizeof(buffer), "wp_%d_flags", id);
	if (n > 0)
		w->write(buf, point.flags);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_name", id);
	if (n > 0)
		w->write(buf, point.name, false);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_pos", id);
	if (n > 0)
		w->write(buf, point.position);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_selected", id);
	if (n > 0)
		w->write(buf, "off", false);
}